

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minpack.cc
# Opt level: O3

bool gmath::slmdif(lmdifFct fct,int m,int n,double *x,double *fvec,void *up,double tol,double step,
                  long *ltmp,double *dtmp)

{
  integer *__ptr;
  long lVar1;
  size_t __nmemb;
  doublereal *local_b0;
  integer info;
  double *local_a0;
  void *local_98;
  integer ldfjacl;
  integer nfevl;
  integer nprint;
  doublereal factor;
  integer model;
  doublereal epsfct;
  integer maxfevl;
  doublereal gtol;
  doublereal xtol;
  doublereal ftol;
  integer np;
  integer mp;
  
  ldfjacl = (integer)m;
  __nmemb = (size_t)n;
  __ptr = (integer *)0x0;
  gtol = 0.0;
  maxfevl = (integer)(n * 200 + 200);
  model = 1;
  factor = 100.0;
  nprint = -1;
  info = 0;
  nfevl = 0;
  local_a0 = x;
  local_98 = up;
  epsfct = step;
  xtol = tol;
  ftol = tol;
  np = __nmemb;
  mp = ldfjacl;
  if (ltmp == (long *)0x0) {
    __ptr = (integer *)calloc(__nmemb,8);
    ltmp = __ptr;
  }
  if (dtmp == (double *)0x0) {
    dtmp = (double *)calloc((long)((m + 5) * n + m),8);
    local_b0 = dtmp;
  }
  else {
    local_b0 = (doublereal *)0x0;
  }
  lVar1 = (long)(m * n);
  lmdif_cvkit((S_fp)fct,&mp,&np,local_a0,fvec,&ftol,&xtol,&gtol,&maxfevl,&epsfct,dtmp,&model,&factor
              ,&nprint,&info,&nfevl,dtmp + __nmemb,&ldfjacl,ltmp,dtmp + __nmemb + lVar1,
              dtmp + n * 2 + lVar1,dtmp + n * 3 + lVar1,dtmp + (n << 2) + lVar1,dtmp + n * 5 + lVar1
              ,local_98);
  free(__ptr);
  free(local_b0);
  return info < 5;
}

Assistant:

bool slmdif(lmdifFct fct, int m, int n, double x[], double fvec[], void *up,
            double tol, double step, long ltmp[], double dtmp[])
{
  integer    mp=static_cast<integer>(m);
  integer    np=static_cast<integer>(n);
  doublereal ftol=tol, xtol=tol, gtol=0;
  integer    maxfevl=static_cast<integer>(200*(n+1));
  doublereal epsfct=step;
  integer    model=1;
  doublereal factor=100;
  integer    nprint=-1;
  integer    info=0;
  integer    nfevl=0;
  integer    ldfjacl=(integer) m;

  long       *altmp=0;
  double     *adtmp=0;

  if (ltmp == 0)
  {
    ltmp=altmp=static_cast<long *>(calloc(n, sizeof(long)));
  }

  if (dtmp == 0)
  {
    dtmp=adtmp=static_cast<double *>(calloc(5*n+m*n+m, sizeof(double)));
  }

  lmdif_cvkit(reinterpret_cast<S_fp>(fct), &mp, &np, x, fvec, &ftol, &xtol, &gtol, &maxfevl, &epsfct,
              dtmp, &model, &factor, &nprint, &info, &nfevl, dtmp+n, &ldfjacl, ltmp,
              dtmp+n+m*n, dtmp+2*n+n*m, dtmp+3*n+n*m, dtmp+4*n+n*m, dtmp+5*n+n*m, up);

  free(altmp);
  free(adtmp);

  assert(info >= 1);

  return info <= 4;
}